

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printCurrentTestStarted(TestOutput *this,UtestShell *test)

{
  uint uVar1;
  char *pcVar2;
  SimpleString local_28;
  UtestShell *local_18;
  UtestShell *test_local;
  TestOutput *this_local;
  
  local_18 = test;
  test_local = (UtestShell *)this;
  if (0 < (int)this->verbose_) {
    (*test->_vptr_UtestShell[5])();
    pcVar2 = SimpleString::asCharString(&local_28);
    (*this->_vptr_TestOutput[0xb])(this,pcVar2);
    SimpleString::~SimpleString(&local_28);
  }
  uVar1 = (*local_18->_vptr_UtestShell[6])();
  if ((uVar1 & 1) == 0) {
    (*this->_vptr_TestOutput[0x11])(this,"!");
  }
  else {
    (*this->_vptr_TestOutput[0x11])(this,".");
  }
  return;
}

Assistant:

void TestOutput::printCurrentTestStarted(const UtestShell& test)
{
    if (verbose_ > level_quiet) print(test.getFormattedName().asCharString());

    if (test.willRun()) {
       setProgressIndicator(".");
    }
    else {
       setProgressIndicator("!");
    }
}